

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH64_hash_t
XXH3_hashLong_64b_withSeed(void *input,size_t len,XXH64_hash_t seed,xxh_u8 *secret,size_t secretLen)

{
  XXH64_hash_t XVar1;
  XXH3_f_initCustomSecret in_stack_00000090;
  XXH3_f_scrambleAcc in_stack_00000098;
  XXH3_f_accumulate_512 in_stack_000000a0;
  XXH64_hash_t in_stack_000000a8;
  size_t in_stack_000000b0;
  void *in_stack_000000b8;
  
  XVar1 = XXH3_hashLong_64b_withSeed_internal
                    (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                     in_stack_00000098,in_stack_00000090);
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t XXH3_hashLong_64b_withSeed(const void* input,
                                                      size_t len,
                                                      XXH64_hash_t seed,
                                                      const xxh_u8* secret,
                                                      size_t secretLen) {
  (void)secret;
  (void)secretLen;
  return XXH3_hashLong_64b_withSeed_internal(
      input, len, seed, XXH3_accumulate_512, XXH3_scrambleAcc,
      XXH3_initCustomSecret);
}